

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

WebSocketPipe * kj::newWebSocketPipe(void)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  WebSocket *pWVar3;
  WebSocket *pWVar4;
  WebSocketPipeImpl *refcounted;
  WebSocketPipeEnd *ptrCopy;
  WebSocketPipe *in_RDI;
  Refcounted *refcounted_3;
  WebSocketPipeImpl *refcounted_2;
  Refcounted *refcounted_1;
  
  pp_Var1 = (_func_int **)operator_new(0x78);
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[0xc] = (_func_int *)0x0;
  pp_Var1[0xd] = (_func_int *)0x0;
  pp_Var1[0xe] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR_send_006d7690;
  pp_Var1[1] = (_func_int *)&PTR_disposeImpl_006d7710;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 9) = 0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 0xc) = 0;
  *(undefined4 *)(pp_Var1 + 2) = 1;
  pp_Var2 = (_func_int **)operator_new(0x78);
  pp_Var2[4] = (_func_int *)0x0;
  pp_Var2[5] = (_func_int *)0x0;
  pp_Var2[2] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)0x0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  pp_Var2[8] = (_func_int *)0x0;
  pp_Var2[9] = (_func_int *)0x0;
  pp_Var2[0xc] = (_func_int *)0x0;
  pp_Var2[0xd] = (_func_int *)0x0;
  pp_Var2[0xe] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR_send_006d7690;
  pp_Var2[1] = (_func_int *)&PTR_disposeImpl_006d7710;
  pp_Var2[3] = (_func_int *)0x0;
  pp_Var2[4] = (_func_int *)0x0;
  pp_Var2[5] = (_func_int *)0x0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  pp_Var2[8] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 9) = 0;
  pp_Var2[10] = (_func_int *)0x0;
  pp_Var2[0xb] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 0xc) = 0;
  *(undefined4 *)(pp_Var1 + 2) = 2;
  *(undefined4 *)(pp_Var2 + 2) = 2;
  pWVar3 = (WebSocket *)operator_new(0x28);
  pWVar3->_vptr_WebSocket = (_func_int **)&PTR_send_006d8038;
  pWVar3[1]._vptr_WebSocket = pp_Var1 + 1;
  pWVar3[2]._vptr_WebSocket = pp_Var1;
  pWVar3[3]._vptr_WebSocket = pp_Var2 + 1;
  pWVar3[4]._vptr_WebSocket = pp_Var2;
  pWVar4 = (WebSocket *)operator_new(0x28);
  pWVar4->_vptr_WebSocket = (_func_int **)&PTR_send_006d8038;
  pWVar4[1]._vptr_WebSocket = pp_Var2 + 1;
  pWVar4[2]._vptr_WebSocket = pp_Var2;
  pWVar4[3]._vptr_WebSocket = pp_Var1 + 1;
  pWVar4[4]._vptr_WebSocket = pp_Var1;
  in_RDI->ends[0].disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::WebSocketPipeEnd>::instance;
  in_RDI->ends[0].ptr = pWVar3;
  in_RDI->ends[1].disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::WebSocketPipeEnd>::instance;
  in_RDI->ends[1].ptr = pWVar4;
  return in_RDI;
}

Assistant:

WebSocketPipe newWebSocketPipe() {
  auto pipe1 = kj::rc<WebSocketPipeImpl>();
  auto pipe2 = kj::rc<WebSocketPipeImpl>();

  auto end1 = kj::heap<WebSocketPipeEnd>(pipe1.addRef(), pipe2.addRef());
  auto end2 = kj::heap<WebSocketPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));

  return { { kj::mv(end1), kj::mv(end2) } };
}